

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall icu_63::TimeZoneRule::operator==(TimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  
  if (this == that) {
    return '\x01';
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if (((bVar1) && (UVar2 = UnicodeString::operator==(&this->fName,&that->fName), UVar2 != '\0')) &&
     (this->fRawOffset == that->fRawOffset)) {
    return this->fDSTSavings == that->fDSTSavings;
  }
  return '\0';
}

Assistant:

UBool
TimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            fName == that.fName &&
            fRawOffset == that.fRawOffset &&
            fDSTSavings == that.fDSTSavings));
}